

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Vector * __thiscall Matrix::operator*(Vector *__return_storage_ptr__,Matrix *this,Vector *other)

{
  runtime_error *this_00;
  long lVar1;
  double dVar2;
  _Vector_base<double,_std::allocator<double>_> local_40;
  
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)this->rows,(allocator_type *)&local_40);
  if ((long)(other->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(other->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 == (long)this->cols) {
    for (lVar1 = 0; lVar1 < this->rows; lVar1 = lVar1 + 1) {
      GetRow((Vector *)&local_40,this,(int)lVar1);
      dVar2 = Utils::ScalarMultiply((Vector *)&local_40,other);
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar1] = dVar2;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unsupported sizes");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vector Matrix::operator*(const Vector& other) const
{
    Vector product = Vector(rows);

    if (other.size() != cols)
    {
        throw std::runtime_error("Unsupported sizes");
    }

    for (int i = 0; i < rows; ++i)
    {
        product[i] = Utils::ScalarMultiply(GetRow(i), other);
    }

    return product;
}